

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int cm_zlib_inflatePrime(z_streamp strm,int bits,int value)

{
  uint uVar1;
  internal_state *piVar2;
  int iVar3;
  
  iVar3 = inflateStateCheck(strm);
  if (iVar3 != 0) {
    return -2;
  }
  piVar2 = strm->state;
  if (bits < 0) {
    piVar2->w_size = 0;
    piVar2->w_bits = 0;
    piVar2->w_mask = 0;
  }
  else {
    if (0x10 < bits) {
      return -2;
    }
    uVar1 = piVar2->w_mask + bits;
    if (0x20 < uVar1) {
      return -2;
    }
    *(ulong *)&piVar2->w_size =
         *(long *)&piVar2->w_size +
         (ulong)((~(uint)(-1L << ((byte)bits & 0x3f)) & value) << ((byte)piVar2->w_mask & 0x1f));
    piVar2->w_mask = uVar1;
  }
  return 0;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + (uInt)bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += (unsigned)value << state->bits;
    state->bits += (uInt)bits;
    return Z_OK;
}